

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  size_t sVar1;
  
  sVar1 = ZSTD_checkCParams(cparams);
  if ((sVar1 < 0xffffffffffffff89) && (sVar1 = 0xffffffffffffffc4, cctx->streamStage == zcss_init))
  {
    sVar1 = 0xffffffffffffffd6;
    if (cparams.windowLog == 0 || 0xffffffe9 < cparams.windowLog - 0x20) {
      (cctx->requestedParams).cParams.windowLog = cparams.windowLog;
      if (cparams.chainLog == 0 || 0xffffffe6 < cparams.chainLog - 0x1f) {
        (cctx->requestedParams).cParams.chainLog = cparams.chainLog;
        if (cparams.hashLog == 0 || 0xffffffe6 < cparams.hashLog - 0x1f) {
          (cctx->requestedParams).cParams.hashLog = cparams.hashLog;
          if (cparams.searchLog < 0x1f) {
            (cctx->requestedParams).cParams.searchLog = cparams.searchLog;
            if ((cparams.minMatch - 3 < 5) || (cparams.minMatch == 0)) {
              (cctx->requestedParams).cParams.minMatch = cparams.minMatch;
              if (cparams.targetLength < 0x20001) {
                (cctx->requestedParams).cParams.targetLength = cparams.targetLength;
                if (cparams.strategy < (ZSTD_btultra|ZSTD_dfast)) {
                  (cctx->requestedParams).cParams.strategy = cparams.strategy;
                  sVar1 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}